

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

void __thiscall smf::MidiMessage::makePitchBendDouble(MidiMessage *this,int channel,double value)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  byte local_33;
  byte local_32;
  byte local_31;
  uchar msb;
  ulong uStack_30;
  uchar lsb;
  ulong uivalue;
  double dvalue;
  double value_local;
  MidiMessage *pMStack_10;
  int channel_local;
  MidiMessage *this_local;
  
  dvalue = value;
  value_local._4_4_ = channel;
  pMStack_10 = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0);
  dVar2 = dvalue + 1.0;
  dVar3 = pow(2.0,15.0);
  uivalue = (ulong)(dVar2 * dVar3);
  if ((double)uivalue < 0.0) {
    uivalue = 0;
  }
  uVar1 = uivalue;
  dVar2 = pow(2.0,15.0);
  if (dVar2 - 1.0 < (double)uVar1) {
    dVar2 = pow(2.0,15.0);
    uivalue = (ulong)(dVar2 - 1.0);
  }
  uStack_30 = (long)(double)uivalue |
              (long)((double)uivalue - 9.223372036854776e+18) & (long)(double)uivalue >> 0x3f;
  local_31 = (byte)uStack_30 & 0x7f;
  local_32 = (byte)(uStack_30 >> 7) & 0x7f;
  local_33 = (byte)value_local._4_4_ & 0x7f | 0xe0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_33);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_31);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_32);
  return;
}

Assistant:

void MidiMessage::makePitchBendDouble(int channel, double value) {
	// value is in the range from -1 for minimum and 2^18 - 1 for the maximum
	resize(0);
	double dvalue = (value + 1.0) * (pow(2.0, 15.0));
	if (dvalue < 0.0) {
		dvalue = 0.0;
	}
	if (dvalue > pow(2.0, 15.0) - 1.0) {
		dvalue = pow(2.0, 15.0) - 1.0;
	}
	ulong uivalue = (ulong)dvalue;
	uchar lsb = uivalue & 0x7f;
	uchar msb = (uivalue >> 7) & 0x7f;
	push_back(0xe0 | (0x7f & channel));
	push_back(lsb);
	push_back(msb);
}